

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

UINT16 UINT8_Marshal(UINT8 *source,BYTE **buffer,INT32 *size)

{
  int iVar1;
  
  if ((buffer != (BYTE **)0x0) &&
     ((size == (INT32 *)0x0 || (iVar1 = *size, *size = iVar1 + -1, 0 < iVar1)))) {
    **buffer = *source;
    *buffer = *buffer + 1;
  }
  return 1;
}

Assistant:

UINT16 UINT8_Marshal(UINT8 *source, BYTE **buffer, INT32 *size)
{
    if (buffer != 0)
    {
        if ((size == 0) || ((*size -= 1) >= 0))
        {
            UINT8_TO_BYTE_ARRAY(*source, *buffer);
            *buffer += 1;
        }
        //pAssert(size == 0 || (*size >= 0));
    }
    return (1);
}